

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

size_t aead_encrypt(st_ptls_traffic_protection_t *ctx,void *output,void *input,size_t inlen,
                   uint8_t content_type)

{
  st_ptls_aead_context_t *psVar1;
  uint64_t uVar2;
  long lVar3;
  uint8_t aad [5];
  ptls_iovec_t invec [2];
  uint8_t local_3e;
  undefined2 local_3d;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  ptls_iovec_t local_38;
  uint8_t *local_28;
  undefined8 local_20;
  
  local_28 = &local_3e;
  local_20 = 1;
  psVar1 = ctx->aead;
  lVar3 = psVar1->algo->tag_size + inlen + 1;
  local_3d = 0x317;
  local_3b = 3;
  local_3a = (undefined1)((ulong)lVar3 >> 8);
  local_39 = (undefined1)lVar3;
  uVar2 = ctx->seq;
  ctx->seq = uVar2 + 1;
  local_3e = content_type;
  local_38.base = (uint8_t *)input;
  local_38.len = inlen;
  (*psVar1->do_encrypt_v)(psVar1,output,&local_38,2,uVar2,&local_3d,5);
  return inlen + 1 + ctx->aead->algo->tag_size;
}

Assistant:

static size_t aead_encrypt(struct st_ptls_traffic_protection_t *ctx, void *output, const void *input, size_t inlen,
                           uint8_t content_type)
{
    ptls_iovec_t invec[2] = {ptls_iovec_init(input, inlen), ptls_iovec_init(&content_type, 1)};
    uint8_t aad[5];

    build_aad(aad, inlen + 1 + ctx->aead->algo->tag_size);
    ptls_aead_encrypt_v(ctx->aead, output, invec, PTLS_ELEMENTSOF(invec), ctx->seq++, aad, sizeof(aad));

    return inlen + 1 + ctx->aead->algo->tag_size;
}